

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O0

void __thiscall DBaseStatusBar::DrawMessages(DBaseStatusBar *this,int layer,int bottom)

{
  uint uVar1;
  DHUDMessage *pDVar2;
  DHUDMessage *next;
  DHUDMessage *pDStack_20;
  int visibility;
  DHUDMessage *msg;
  int bottom_local;
  int layer_local;
  DBaseStatusBar *this_local;
  
  pDStack_20 = ::TObjPtr::operator_cast_to_DHUDMessage_((TObjPtr *)(this->Messages + layer));
  next._4_4_ = (uint)((viewactive & 1U) != 0);
  if ((automapactive & 1U) != 0) {
    uVar1 = 2;
    if ((viewactive & 1U) != 0) {
      uVar1 = 4;
    }
    next._4_4_ = uVar1 | next._4_4_;
  }
  while (pDStack_20 != (DHUDMessage *)0x0) {
    pDVar2 = ::TObjPtr::operator_cast_to_DHUDMessage_((TObjPtr *)&pDStack_20->Next);
    DHUDMessage::Draw(pDStack_20,bottom,next._4_4_);
    pDStack_20 = pDVar2;
  }
  return;
}

Assistant:

void DBaseStatusBar::DrawMessages (int layer, int bottom)
{
	DHUDMessage *msg = Messages[layer];
	int visibility = 0;

	if (viewactive)
	{
		visibility |= HUDMSG_NotWith3DView;
	}
	if (automapactive)
	{
		visibility |= viewactive ? HUDMSG_NotWithOverlayMap : HUDMSG_NotWithFullMap;
	}
	while (msg)
	{
		DHUDMessage *next = msg->Next;
		msg->Draw (bottom, visibility);
		msg = next;
	}
}